

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json.hpp
# Opt level: O2

out_of_range *
nlohmann::detail::out_of_range::create
          (out_of_range *__return_storage_ptr__,int id_,string *what_arg)

{
  undefined1 local_88 [8];
  string w;
  string local_48;
  allocator local_21;
  
  std::__cxx11::string::string((string *)&local_48,"out_of_range",&local_21);
  exception::name((string *)((long)&w.field_2 + 8),&local_48,id_);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_88,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 ((long)&w.field_2 + 8),what_arg);
  std::__cxx11::string::~string((string *)(w.field_2._M_local_buf + 8));
  std::__cxx11::string::~string((string *)&local_48);
  out_of_range(__return_storage_ptr__,id_,(char *)local_88);
  std::__cxx11::string::~string((string *)local_88);
  return __return_storage_ptr__;
}

Assistant:

static out_of_range create(int id_, const std::string& what_arg)
    {
        std::string w = exception::name("out_of_range", id_) + what_arg;
        return out_of_range(id_, w.c_str());
    }